

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall MutableS2ShapeIndex::Encode(MutableS2ShapeIndex *this,Encoder *encoder)

{
  pointer puVar1;
  pointer puVar2;
  atomic<const_S2ShapeIndexCell_*> this_00;
  Encoder *encoder_00;
  Encoder *in_RCX;
  Span<const_S2CellId> v;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  S2CellId local_b0;
  StringVectorEncoder encoded_cells;
  Iterator it;
  
  Encoder::Ensure(encoder,10);
  Encoder::put_varint64(encoder,(long)(this->options_).max_edges_per_cell_ << 2);
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            (&cell_ids,
             (this->cell_map_).
             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .
             super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .
             super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
             .tree_.size_);
  s2coding::StringVectorEncoder::StringVectorEncoder(&encoded_cells);
  Iterator::Iterator(&it,this,BEGIN);
  while (it.super_IteratorBase.id_.id_ != 0xffffffffffffffff) {
    local_b0.id_ = it.super_IteratorBase.id_.id_;
    std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>(&cell_ids,&local_b0);
    this_00 = it.super_IteratorBase.cell_;
    puVar1 = (this->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->shapes_).
             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    encoder_00 = s2coding::StringVectorEncoder::AddViaEncoder(&encoded_cells);
    S2ShapeIndexCell::Encode
              ((S2ShapeIndexCell *)this_00._M_b._M_p,
               (int)((ulong)((long)puVar2 - (long)puVar1) >> 3),encoder_00);
    Iterator::Next(&it);
  }
  v.ptr_ = (pointer)((long)cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3);
  v.len_ = (size_type)encoder;
  s2coding::EncodeS2CellIdVector
            ((s2coding *)
             cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_start,v,in_RCX);
  s2coding::StringVectorEncoder::Encode(&encoded_cells,encoder);
  s2coding::StringVectorEncoder::~StringVectorEncoder(&encoded_cells);
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base
            (&cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>);
  return;
}

Assistant:

void MutableS2ShapeIndex::Encode(Encoder* encoder) const {
  // The version number is encoded in 2 bits, under the assumption that by the
  // time we need 5 versions the first version can be permanently retired.
  // This only saves 1 byte, but that's significant for very small indexes.
  encoder->Ensure(Varint::kMax64);
  uint64 max_edges = options_.max_edges_per_cell();
  encoder->put_varint64(max_edges << 2 | kCurrentEncodingVersionNumber);

  vector<S2CellId> cell_ids;
  cell_ids.reserve(cell_map_.size());
  s2coding::StringVectorEncoder encoded_cells;
  for (Iterator it(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    cell_ids.push_back(it.id());
    it.cell().Encode(num_shape_ids(), encoded_cells.AddViaEncoder());
  }
  s2coding::EncodeS2CellIdVector(cell_ids, encoder);
  encoded_cells.Encode(encoder);
}